

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_readfile.cc
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  float fVar2;
  timeval end;
  timeval begin;
  char *in_stack_00000080;
  timeval local_30;
  timeval local_20 [2];
  
  gettimeofday(local_20,(__timezone_ptr_t)0x0);
  readfile(in_stack_00000080);
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  poVar1 = std::operator<<((ostream *)&std::cout,"read time used:");
  fVar2 = get_elapse_time((timeval *)local_20,(timeval *)&local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)fVar2);
  poVar1 = std::operator<<(poVar1," ms");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  struct timeval begin, end;
  gettimeofday(&begin, NULL);
  readfile(argv[1]);
  gettimeofday(&end, NULL);
  std::cout<<"read time used:"<<int(get_elapse_time(&begin, &end))<<" ms"<<std::endl;
}